

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

iterator * __thiscall
NNTreeImpl::insertFirst
          (iterator *__return_storage_ptr__,NNTreeImpl *this,QPDFObjectHandle *key,
          QPDFObjectHandle *value)

{
  QPDF *qpdf;
  bool bVar1;
  iterator parent;
  QPDFObjectHandle local_b0;
  _List_node_base *local_a0;
  QPDFObjectHandle local_98;
  allocator<char> local_81;
  string local_80;
  QPDFObjectHandle local_60 [2];
  undefined1 local_40 [8];
  QPDFObjectHandle items;
  QPDFObjectHandle *value_local;
  QPDFObjectHandle *key_local;
  NNTreeImpl *this_local;
  iterator *iter;
  
  items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 0;
  begin(__return_storage_ptr__,this);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_40);
  bVar1 = QPDFObjectHandle::isDictionary(&__return_storage_ptr__->node);
  if (bVar1) {
    (*(code *)**(undefined8 **)this->details)();
    QPDFObjectHandle::getKey(local_60,(string *)&__return_storage_ptr__->node);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)local_40,local_60);
    QPDFObjectHandle::~QPDFObjectHandle(local_60);
  }
  bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_40);
  if (!bVar1) {
    QTC::TC("qpdf","NNTree no valid items node in insertFirst",0);
    qpdf = this->qpdf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"unable to find a valid items node",&local_81);
    ::error(qpdf,&this->oh,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  QPDFObjectHandle::insertItem((QPDFObjectHandle *)local_40,0,key);
  QPDFObjectHandle::insertItem((QPDFObjectHandle *)local_40,1,value);
  NNTreeIterator::setItemNumber(__return_storage_ptr__,&__return_storage_ptr__->node,0);
  QPDFObjectHandle::QPDFObjectHandle(&local_98,&__return_storage_ptr__->node);
  local_a0 = (_List_node_base *)NNTreeIterator::lastPathElement(__return_storage_ptr__);
  NNTreeIterator::resetLimits(__return_storage_ptr__,&local_98,(iterator)local_a0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_98);
  QPDFObjectHandle::QPDFObjectHandle(&local_b0,&__return_storage_ptr__->node);
  parent = NNTreeIterator::lastPathElement(__return_storage_ptr__);
  NNTreeIterator::split(__return_storage_ptr__,&local_b0,parent);
  QPDFObjectHandle::~QPDFObjectHandle(&local_b0);
  items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 1;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_40);
  if ((items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_ & 1) == 0) {
    NNTreeIterator::~NNTreeIterator(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

NNTreeImpl::iterator
NNTreeImpl::insertFirst(QPDFObjectHandle key, QPDFObjectHandle value)
{
    auto iter = begin();
    QPDFObjectHandle items;
    if (iter.node.isDictionary()) {
        items = iter.node.getKey(details.itemsKey());
    }
    if (!(items.isArray())) {
        QTC::TC("qpdf", "NNTree no valid items node in insertFirst");
        error(qpdf, this->oh, "unable to find a valid items node");
    }
    items.insertItem(0, key);
    items.insertItem(1, value);
    iter.setItemNumber(iter.node, 0);
    iter.resetLimits(iter.node, iter.lastPathElement());
    iter.split(iter.node, iter.lastPathElement());
    return iter;
}